

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void helper_booke206_tlbre_ppc64(CPUPPCState_conflict2 *env)

{
  ppcmas_tlb_t *tlb_00;
  ppcmas_tlb_t *tlb;
  CPUPPCState_conflict2 *env_local;
  
  tlb_00 = booke206_cur_tlb(env);
  if (tlb_00 == (ppcmas_tlb_t *)0x0) {
    env->spr[0x271] = 0;
  }
  else {
    booke206_tlb_to_mas(env,tlb_00);
  }
  return;
}

Assistant:

void helper_booke206_tlbre(CPUPPCState *env)
{
    ppcmas_tlb_t *tlb = NULL;

    tlb = booke206_cur_tlb(env);
    if (!tlb) {
        env->spr[SPR_BOOKE_MAS1] = 0;
    } else {
        booke206_tlb_to_mas(env, tlb);
    }
}